

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int tx_elements_input_issuance_proof_init
              (wally_tx_input *input,uchar *issuance_amount_rangeproof,
              size_t issuance_amount_rangeproof_len,uchar *inflation_keys_rangeproof,
              size_t inflation_keys_rangeproof_len)

{
  _Bool _Var1;
  uchar *local_48;
  uchar *new_inflation_keys_rangeproof;
  uchar *new_issuance_amount_rangeproof;
  size_t inflation_keys_rangeproof_len_local;
  uchar *inflation_keys_rangeproof_local;
  size_t issuance_amount_rangeproof_len_local;
  uchar *issuance_amount_rangeproof_local;
  wally_tx_input *input_local;
  
  new_inflation_keys_rangeproof = (uchar *)0x0;
  local_48 = (uchar *)0x0;
  if (((issuance_amount_rangeproof != (uchar *)0x0) == (issuance_amount_rangeproof_len != 0)) &&
     ((inflation_keys_rangeproof != (uchar *)0x0) == (inflation_keys_rangeproof_len != 0))) {
    new_issuance_amount_rangeproof = (uchar *)inflation_keys_rangeproof_len;
    inflation_keys_rangeproof_len_local = (size_t)inflation_keys_rangeproof;
    inflation_keys_rangeproof_local = (uchar *)issuance_amount_rangeproof_len;
    issuance_amount_rangeproof_len_local = (size_t)issuance_amount_rangeproof;
    issuance_amount_rangeproof_local = input->txhash;
    _Var1 = clone_bytes(&new_inflation_keys_rangeproof,issuance_amount_rangeproof,
                        issuance_amount_rangeproof_len);
    if ((_Var1) &&
       (_Var1 = clone_bytes(&local_48,(uchar *)inflation_keys_rangeproof_len_local,
                            (size_t)new_issuance_amount_rangeproof), _Var1)) {
      *(uchar **)(issuance_amount_rangeproof_local + 0xa8) = new_inflation_keys_rangeproof;
      *(uchar **)(issuance_amount_rangeproof_local + 0xb0) = inflation_keys_rangeproof_local;
      *(uchar **)(issuance_amount_rangeproof_local + 0xb8) = local_48;
      *(uchar **)(issuance_amount_rangeproof_local + 0xc0) = new_issuance_amount_rangeproof;
      input_local._4_4_ = 0;
    }
    else {
      clear_and_free(new_inflation_keys_rangeproof,(size_t)inflation_keys_rangeproof_local);
      clear_and_free(local_48,(size_t)new_issuance_amount_rangeproof);
      input_local._4_4_ = -3;
    }
  }
  else {
    input_local._4_4_ = -2;
  }
  return input_local._4_4_;
}

Assistant:

static int tx_elements_input_issuance_proof_init(
    struct wally_tx_input *input,
    const unsigned char *issuance_amount_rangeproof,
    size_t issuance_amount_rangeproof_len,
    const unsigned char *inflation_keys_rangeproof,
    size_t inflation_keys_rangeproof_len)
{
#ifdef BUILD_ELEMENTS
    unsigned char *new_issuance_amount_rangeproof = NULL, *new_inflation_keys_rangeproof = NULL;
#endif
    (void) input;

    if (BYTES_INVALID(issuance_amount_rangeproof, issuance_amount_rangeproof_len) ||
        BYTES_INVALID(inflation_keys_rangeproof, inflation_keys_rangeproof_len))
        return WALLY_EINVAL;

#ifdef BUILD_ELEMENTS
    if (!clone_bytes(&new_issuance_amount_rangeproof, issuance_amount_rangeproof, issuance_amount_rangeproof_len) ||
        !clone_bytes(&new_inflation_keys_rangeproof, inflation_keys_rangeproof, inflation_keys_rangeproof_len)) {
        clear_and_free(new_issuance_amount_rangeproof, issuance_amount_rangeproof_len);
        clear_and_free(new_inflation_keys_rangeproof, inflation_keys_rangeproof_len);
        return WALLY_ENOMEM;
    }

    input->issuance_amount_rangeproof = new_issuance_amount_rangeproof;
    input->issuance_amount_rangeproof_len = issuance_amount_rangeproof_len;
    input->inflation_keys_rangeproof = new_inflation_keys_rangeproof;
    input->inflation_keys_rangeproof_len = inflation_keys_rangeproof_len;
#endif
    return WALLY_OK;
}